

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake3.c
# Opt level: O0

void blake3_hasher_finalize(blake3_hasher *self,uint8_t *out,size_t out_len)

{
  undefined8 *puVar1;
  long lVar2;
  ulong in_RDX;
  void *in_RSI;
  undefined8 *in_RDI;
  output_t ret_3;
  uint8_t parent_block [64];
  output_t ret_2;
  output_t ret_1;
  size_t cvs_remaining;
  output_t output;
  output_t output_1;
  uint8_t block_flags_1;
  uint8_t block_flags;
  uint32_t cv_words [8];
  size_t memcpy_len_1;
  uint8_t wide_buf_1 [64];
  uint64_t output_block_counter_1;
  size_t memcpy_len;
  uint8_t wide_buf [64];
  uint64_t output_block_counter;
  uint8_t *in_stack_fffffffffffffb38;
  undefined4 in_stack_fffffffffffffb44;
  undefined4 uVar3;
  uint8_t *in_stack_fffffffffffffb48;
  uint32_t *in_stack_fffffffffffffb50;
  uint8_t *in_stack_fffffffffffffb58;
  uint32_t *in_stack_fffffffffffffb60;
  undefined1 auStack_490 [64];
  undefined1 local_450;
  byte local_44f;
  undefined8 local_448;
  undefined8 local_440;
  undefined8 local_438;
  undefined8 local_430;
  undefined8 local_428 [5];
  undefined8 local_400;
  undefined8 local_3f8;
  undefined8 local_3f0;
  undefined8 local_3e8;
  undefined8 local_3e0;
  undefined1 auStack_3d8 [64];
  undefined1 local_398;
  byte local_397;
  undefined8 local_390;
  undefined8 local_388;
  undefined8 local_380;
  undefined8 local_378;
  undefined8 local_370;
  undefined1 auStack_368 [64];
  undefined1 local_328;
  byte local_327;
  ulong local_320;
  undefined8 local_318;
  undefined8 local_310;
  undefined8 local_308;
  undefined8 local_300;
  undefined8 local_2a8;
  undefined8 local_2a0;
  undefined8 local_298;
  undefined8 local_290;
  undefined8 local_288;
  undefined1 auStack_280 [64];
  undefined1 local_240;
  byte local_23f;
  ulong local_238;
  void *local_230;
  undefined8 *local_228;
  undefined8 *local_220;
  byte local_211;
  undefined8 *local_210;
  byte local_201;
  undefined8 *local_200;
  undefined8 local_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined8 *local_1d0;
  undefined8 *local_1c8;
  size_t local_1c0;
  undefined1 local_1b8 [72];
  long local_170;
  ulong local_168;
  void *local_160;
  undefined8 *local_158;
  size_t local_150;
  undefined1 local_148 [64];
  long local_108;
  ulong local_100;
  void *local_f8;
  undefined8 *local_f0;
  byte local_e1;
  undefined8 *local_e0;
  undefined8 *local_d8;
  byte local_c9;
  void *local_c0;
  undefined8 *local_b8;
  undefined1 local_a9;
  undefined8 *local_a8;
  undefined1 local_9a;
  byte local_99;
  undefined8 local_98;
  undefined1 local_89;
  void *local_88;
  byte local_71;
  undefined8 local_70;
  undefined1 local_61;
  undefined8 *local_60;
  undefined8 *local_58;
  byte local_49;
  undefined8 local_48;
  undefined1 local_39;
  undefined8 *local_38;
  undefined8 *local_30;
  byte local_21;
  undefined8 local_20;
  undefined1 local_11;
  undefined8 *local_10;
  undefined8 *local_8;
  
  local_238 = in_RDX;
  local_230 = in_RSI;
  if (*(char *)(in_RDI + 0x12) == '\0') {
    local_200 = in_RDI + 4;
    uVar3 = 0;
    local_a9 = *(char *)((long)in_RDI + 0x89) == '\0';
    local_201 = *(byte *)((long)in_RDI + 0x8a) | local_a9 | 2;
    local_38 = in_RDI + 9;
    local_39 = *(undefined1 *)(in_RDI + 0x11);
    local_48 = in_RDI[8];
    local_2a8 = *local_200;
    local_2a0 = in_RDI[5];
    local_298 = in_RDI[6];
    local_290 = in_RDI[7];
    local_b8 = local_200;
    local_49 = local_201;
    local_30 = local_200;
    memcpy(auStack_280,local_38,0x40);
    local_240 = local_39;
    local_288 = local_48;
    local_23f = local_49;
    local_f0 = &local_2a8;
    local_f8 = local_230;
    local_108 = 0;
    for (local_100 = local_238; local_100 != 0; local_100 = local_100 - local_150) {
      blake3_compress_xof(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
                          (uint8_t)((ulong)in_stack_fffffffffffffb50 >> 0x38),
                          (uint64_t)in_stack_fffffffffffffb48,(uint8_t)((uint)uVar3 >> 0x18),
                          in_stack_fffffffffffffb38);
      if (local_100 < 0x41) {
        local_150 = local_100;
      }
      else {
        local_150 = 0x40;
      }
      memcpy(local_f8,local_148,local_150);
      local_f8 = (void *)(local_150 + (long)local_f8);
      local_108 = local_108 + 1;
    }
  }
  else {
    local_220 = in_RDI + 4;
    local_228 = in_RDI;
    if ((ulong)*(byte *)((long)in_RDI + 0x89) * 0x40 + (ulong)*(byte *)(in_RDI + 0x11) == 0) {
      local_320 = (ulong)(int)(*(byte *)(in_RDI + 0x12) - 2);
      local_c0 = (void *)((long)in_RDI + local_320 * 0x20 + 0x91);
      local_c9 = *(byte *)((long)in_RDI + 0x8a);
      local_99 = local_c9 | 4;
      local_89 = 0x40;
      local_98 = 0;
      local_400 = *in_RDI;
      local_3f8 = in_RDI[1];
      local_3f0 = in_RDI[2];
      local_3e8 = in_RDI[3];
      local_88 = local_c0;
      memcpy(auStack_3d8,local_c0,0x40);
      local_398 = local_89;
      local_3e0 = local_98;
      local_397 = local_99;
      memcpy(&local_318,&local_400,0x70);
    }
    else {
      local_320 = (ulong)*(byte *)(in_RDI + 0x12);
      local_210 = in_RDI + 4;
      local_9a = *(char *)((long)in_RDI + 0x89) == '\0';
      local_211 = *(byte *)((long)in_RDI + 0x8a) | local_9a | 2;
      local_10 = in_RDI + 9;
      local_11 = *(undefined1 *)(in_RDI + 0x11);
      local_20 = in_RDI[8];
      local_390 = *local_210;
      local_388 = in_RDI[5];
      local_380 = in_RDI[6];
      local_378 = in_RDI[7];
      local_a8 = local_210;
      local_21 = local_211;
      local_8 = local_210;
      memcpy(auStack_368,local_10,0x40);
      local_328 = local_11;
      local_370 = local_20;
      local_327 = local_21;
      memcpy(&local_318,&local_390,0x70);
    }
    while (local_320 != 0) {
      local_320 = local_320 - 1;
      lVar2 = local_320 * 0x20;
      local_448 = *(undefined8 *)((long)local_228 + lVar2 + 0x91);
      local_440 = *(undefined8 *)((long)local_228 + lVar2 + 0x99);
      local_438 = *(undefined8 *)((long)local_228 + lVar2 + 0xa1);
      local_430 = *(undefined8 *)((long)local_228 + lVar2 + 0xa9);
      local_1d0 = local_428;
      local_1c8 = &local_318;
      local_1f8 = local_318;
      local_1f0 = local_310;
      local_1e8 = local_308;
      local_1e0 = local_300;
      blake3_compress_in_place
                (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                 (uint8_t)((uint)in_stack_fffffffffffffb44 >> 0x18),
                 (uint64_t)in_stack_fffffffffffffb38,'\0');
      puVar1 = local_1d0;
      *local_1d0 = local_1f8;
      puVar1[1] = local_1f0;
      puVar1[2] = local_1e8;
      puVar1[3] = local_1e0;
      local_d8 = &local_448;
      local_e1 = *(byte *)((long)local_228 + 0x8a);
      local_e0 = local_228;
      local_71 = local_e1 | 4;
      local_58 = local_228;
      local_61 = 0x40;
      local_70 = 0;
      in_stack_fffffffffffffb48 = (uint8_t *)*local_228;
      in_stack_fffffffffffffb50 = (uint32_t *)local_228[1];
      in_stack_fffffffffffffb58 = (uint8_t *)local_228[2];
      in_stack_fffffffffffffb60 = (uint32_t *)local_228[3];
      local_60 = local_d8;
      memcpy(auStack_490,local_d8,0x40);
      local_450 = local_61;
      local_44f = local_71;
      memcpy(&local_318,&stack0xfffffffffffffb48,0x70);
    }
    local_158 = &local_318;
    local_160 = local_230;
    local_170 = 0;
    for (local_168 = local_238; local_168 != 0; local_168 = local_168 - local_1c0) {
      blake3_compress_xof(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
                          (uint8_t)((ulong)in_stack_fffffffffffffb50 >> 0x38),
                          (uint64_t)in_stack_fffffffffffffb48,
                          (uint8_t)((uint)in_stack_fffffffffffffb44 >> 0x18),
                          in_stack_fffffffffffffb38);
      if (local_168 < 0x41) {
        local_1c0 = local_168;
      }
      else {
        local_1c0 = 0x40;
      }
      memcpy(local_160,local_1b8,local_1c0);
      local_160 = (void *)(local_1c0 + (long)local_160);
      local_170 = local_170 + 1;
    }
  }
  return;
}

Assistant:

void blake3_hasher_finalize(const blake3_hasher *self, uint8_t *out,
                            size_t out_len) {
  // If the subtree stack is empty, then the current chunk is the root.
  if (self->cv_stack_len == 0) {
    output_t output = chunk_state_output(&self->chunk);
    output_root_bytes(&output, out, out_len);
    return;
  }
  // If there are any bytes in the chunk state, finalize that chunk and do a
  // roll-up merge between that chunk hash and every subtree in the stack. In
  // this case, the extra merge loop at the end of blake3_hasher_update
  // guarantees that none of the subtrees in the stack need to be merged with
  // each other first. Otherwise, if there are no bytes in the chunk state,
  // then the top of the stack is a chunk hash, and we start the merge from
  // that.
  output_t output;
  size_t cvs_remaining;
  if (chunk_state_len(&self->chunk) > 0) {
    cvs_remaining = self->cv_stack_len;
    output = chunk_state_output(&self->chunk);
  } else {
    // There are always at least 2 CVs in the stack in this case.
    cvs_remaining = self->cv_stack_len - 2;
    output = parent_output(&self->cv_stack[cvs_remaining * 32], self->key,
                           self->chunk.flags);
  }
  while (cvs_remaining > 0) {
    cvs_remaining -= 1;
    uint8_t parent_block[BLAKE3_BLOCK_LEN];
    memcpy(parent_block, &self->cv_stack[cvs_remaining * 32], 32);
    output_chaining_value(&output, &parent_block[32]);
    output = parent_output(parent_block, self->key, self->chunk.flags);
  }
  output_root_bytes(&output, out, out_len);
}